

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_a4e46::ImageManager::_clone
          (ImageManager *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CopyForm1 p_Var1;
  Image IStack_48;
  
  ImageTypeManager::image(&IStack_48,*(ImageTypeManager **)__fn,(uint8_t)__fn[0x68]);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            ((ImageTemplate<unsigned_char> *)this,&IStack_48,*(uint32_t *)((long)__child_stack + 8),
             *(uint32_t *)((long)__child_stack + 0xc),*(uint8_t *)((long)__child_stack + 0x10),
             '\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&IStack_48);
  p_Var1 = ImageTypeManager::convert
                     (*(ImageTypeManager **)__fn,*(uint8_t *)((long)__child_stack + 0x20),
                      (uint8_t)__fn[0x68]);
  (*p_Var1)((Image *)__child_stack,(Image *)this);
  return (int)this;
}

Assistant:

PenguinV_Image::Image _clone( const PenguinV_Image::Image & in )
        {
            PenguinV_Image::Image temp = _registrator.image( _type ).generate( in.width(), in.height(), in.colorCount() );
            _registrator.convert( in.type(), _type )( in, temp );
            return temp;
        }